

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decl.c
# Opt level: O1

void init_data(void)

{
  char *pcVar1;
  boolean bVar2;
  nh_autopickup_rules *pnVar3;
  nh_msgtype_rules *pnVar4;
  int iVar5;
  
  pnVar4 = iflags.mt_rules;
  pnVar3 = iflags.ap_rules;
  pcVar1 = iflags.hp_notify_fmt;
  iVar5 = (int)(char)program_state.restoring;
  bVar2 = iflags.disable_log;
  moves = 1;
  program_state.game_running = 0;
  program_state.restoring = 0;
  program_state.viewing = 0;
  program_state.gameover = 0;
  program_state.forced_exit = 0;
  program_state.stopprint = 0;
  program_state.something_worth_saving = 0;
  program_state.panicking = 0;
  program_state.in_impossible = 0;
  program_state.in_paniclog = 0;
  memset(&flags,0,0xb0);
  iflags.vision_inited = '\0';
  iflags.pickup_dropped = '\0';
  iflags.pickup_thrown = '\0';
  iflags.travel1 = '\0';
  iflags.travelcc.x = '\0';
  iflags.travelcc.y = '\0';
  iflags.mon_polycontrol = '\0';
  iflags.next_msg_nonblocking = '\0';
  iflags.autodigdown = '\0';
  iflags.menu_match_tight = '\0';
  iflags.paranoid_hit = '\0';
  iflags.paranoid_quit = '\0';
  iflags.paranoid_trap = '\0';
  iflags.paranoid_chat = '\0';
  iflags.paranoid_loot = '\0';
  iflags.paranoid_lava = '\0';
  iflags.paranoid_water = '\0';
  iflags.hp_notify = '\0';
  iflags._18_6_ = 0;
  iflags.hp_notify_fmt = (char *)0x0;
  iflags.delay_msg = '\0';
  iflags.show_uncursed = '\0';
  iflags.showrace = '\0';
  iflags._35_1_ = 0;
  iflags.runmode = 0;
  iflags.pilesize = 0;
  iflags.disable_log = '\0';
  iflags.botl = '\0';
  iflags.autoexplore = '\0';
  iflags._47_1_ = 0;
  iflags.ap_rules = (nh_autopickup_rules *)0x0;
  iflags.mt_rules = (nh_msgtype_rules *)0x0;
  quest_status = (q_score)0x0;
  memset(levels,0,0x1000);
  bases[0] = 0;
  bases[1] = 0;
  bases[2] = 0;
  bases[3] = 0;
  bases[4] = 0;
  bases[5] = 0;
  bases[6] = 0;
  bases[7] = 0;
  bases[8] = 0;
  bases[9] = 0;
  bases[10] = 0;
  bases[0xb] = 0;
  bases[0xc] = 0;
  bases[0xd] = 0;
  bases[0xe] = 0;
  bases[0xf] = 0;
  bases[0x10] = 0;
  bases[0x11] = 0;
  memset(&u,0,0x630);
  dogname[0] = '\0';
  dogname[1] = '\0';
  dogname[2] = '\0';
  dogname[3] = '\0';
  dogname[4] = '\0';
  dogname[5] = '\0';
  dogname[6] = '\0';
  dogname[7] = '\0';
  dogname[8] = '\0';
  dogname[9] = '\0';
  dogname[10] = '\0';
  dogname[0xb] = '\0';
  dogname[0xc] = '\0';
  dogname[0xd] = '\0';
  dogname[0xe] = '\0';
  dogname[0xf] = '\0';
  dogname[0x10] = '\0';
  dogname[0x11] = '\0';
  dogname[0x12] = '\0';
  dogname[0x13] = '\0';
  dogname[0x14] = '\0';
  dogname[0x15] = '\0';
  dogname[0x16] = '\0';
  dogname[0x17] = '\0';
  dogname[0x18] = '\0';
  dogname[0x19] = '\0';
  dogname[0x1a] = '\0';
  dogname[0x1b] = '\0';
  dogname[0x1c] = '\0';
  dogname[0x1d] = '\0';
  dogname[0x1e] = '\0';
  dogname[0x1f] = '\0';
  dogname[0x20] = '\0';
  dogname[0x21] = '\0';
  dogname[0x22] = '\0';
  dogname[0x23] = '\0';
  dogname[0x24] = '\0';
  dogname[0x25] = '\0';
  dogname[0x26] = '\0';
  dogname[0x27] = '\0';
  dogname[0x28] = '\0';
  dogname[0x29] = '\0';
  dogname[0x2a] = '\0';
  dogname[0x2b] = '\0';
  dogname[0x2c] = '\0';
  dogname[0x2d] = '\0';
  dogname[0x2e] = '\0';
  dogname[0x2f] = '\0';
  dogname[0x30] = '\0';
  dogname[0x31] = '\0';
  dogname[0x32] = '\0';
  dogname[0x33] = '\0';
  dogname[0x34] = '\0';
  dogname[0x35] = '\0';
  dogname[0x36] = '\0';
  dogname[0x37] = '\0';
  dogname[0x38] = '\0';
  dogname[0x39] = '\0';
  dogname[0x3a] = '\0';
  dogname[0x3b] = '\0';
  dogname[0x3c] = '\0';
  dogname[0x3d] = '\0';
  dogname[0x3e] = '\0';
  catname[0] = '\0';
  catname[1] = '\0';
  catname[2] = '\0';
  catname[3] = '\0';
  catname[4] = '\0';
  catname[5] = '\0';
  catname[6] = '\0';
  catname[7] = '\0';
  catname[8] = '\0';
  catname[9] = '\0';
  catname[10] = '\0';
  catname[0xb] = '\0';
  catname[0xc] = '\0';
  catname[0xd] = '\0';
  catname[0xe] = '\0';
  catname[0xf] = '\0';
  catname[0x10] = '\0';
  catname[0x11] = '\0';
  catname[0x12] = '\0';
  catname[0x13] = '\0';
  catname[0x14] = '\0';
  catname[0x15] = '\0';
  catname[0x16] = '\0';
  catname[0x17] = '\0';
  catname[0x18] = '\0';
  catname[0x19] = '\0';
  catname[0x1a] = '\0';
  catname[0x1b] = '\0';
  catname[0x1c] = '\0';
  catname[0x1d] = '\0';
  catname[0x1e] = '\0';
  catname[0x1f] = '\0';
  catname[0x20] = '\0';
  catname[0x21] = '\0';
  catname[0x22] = '\0';
  catname[0x23] = '\0';
  catname[0x24] = '\0';
  catname[0x25] = '\0';
  catname[0x26] = '\0';
  catname[0x27] = '\0';
  catname[0x28] = '\0';
  catname[0x29] = '\0';
  catname[0x2a] = '\0';
  catname[0x2b] = '\0';
  catname[0x2c] = '\0';
  catname[0x2d] = '\0';
  catname[0x2e] = '\0';
  catname[0x2f] = '\0';
  catname[0x30] = '\0';
  catname[0x31] = '\0';
  catname[0x32] = '\0';
  catname[0x33] = '\0';
  catname[0x34] = '\0';
  catname[0x35] = '\0';
  catname[0x36] = '\0';
  catname[0x37] = '\0';
  catname[0x38] = '\0';
  catname[0x39] = '\0';
  catname[0x3a] = '\0';
  catname[0x3b] = '\0';
  catname[0x3c] = '\0';
  catname[0x3d] = '\0';
  catname[0x3e] = '\0';
  horsename[0] = '\0';
  horsename[1] = '\0';
  horsename[2] = '\0';
  horsename[3] = '\0';
  horsename[4] = '\0';
  horsename[5] = '\0';
  horsename[6] = '\0';
  horsename[7] = '\0';
  horsename[8] = '\0';
  horsename[9] = '\0';
  horsename[10] = '\0';
  horsename[0xb] = '\0';
  horsename[0xc] = '\0';
  horsename[0xd] = '\0';
  horsename[0xe] = '\0';
  horsename[0xf] = '\0';
  horsename[0x10] = '\0';
  horsename[0x11] = '\0';
  horsename[0x12] = '\0';
  horsename[0x13] = '\0';
  horsename[0x14] = '\0';
  horsename[0x15] = '\0';
  horsename[0x16] = '\0';
  horsename[0x17] = '\0';
  horsename[0x18] = '\0';
  horsename[0x19] = '\0';
  horsename[0x1a] = '\0';
  horsename[0x1b] = '\0';
  horsename[0x1c] = '\0';
  horsename[0x1d] = '\0';
  horsename[0x1e] = '\0';
  horsename[0x1f] = '\0';
  horsename[0x20] = '\0';
  horsename[0x21] = '\0';
  horsename[0x22] = '\0';
  horsename[0x23] = '\0';
  horsename[0x24] = '\0';
  horsename[0x25] = '\0';
  horsename[0x26] = '\0';
  horsename[0x27] = '\0';
  horsename[0x28] = '\0';
  horsename[0x29] = '\0';
  horsename[0x2a] = '\0';
  horsename[0x2b] = '\0';
  horsename[0x2c] = '\0';
  horsename[0x2d] = '\0';
  horsename[0x2e] = '\0';
  horsename[0x2f] = '\0';
  horsename[0x30] = '\0';
  horsename[0x31] = '\0';
  horsename[0x32] = '\0';
  horsename[0x33] = '\0';
  horsename[0x34] = '\0';
  horsename[0x35] = '\0';
  horsename[0x36] = '\0';
  horsename[0x37] = '\0';
  horsename[0x38] = '\0';
  horsename[0x39] = '\0';
  horsename[0x3a] = '\0';
  horsename[0x3b] = '\0';
  horsename[0x3c] = '\0';
  horsename[0x3d] = '\0';
  horsename[0x3e] = '\0';
  monkeyname[0] = '\0';
  monkeyname[1] = '\0';
  monkeyname[2] = '\0';
  monkeyname[3] = '\0';
  monkeyname[4] = '\0';
  monkeyname[5] = '\0';
  monkeyname[6] = '\0';
  monkeyname[7] = '\0';
  monkeyname[8] = '\0';
  monkeyname[9] = '\0';
  monkeyname[10] = '\0';
  monkeyname[0xb] = '\0';
  monkeyname[0xc] = '\0';
  monkeyname[0xd] = '\0';
  monkeyname[0xe] = '\0';
  monkeyname[0xf] = '\0';
  monkeyname[0x10] = '\0';
  monkeyname[0x11] = '\0';
  monkeyname[0x12] = '\0';
  monkeyname[0x13] = '\0';
  monkeyname[0x14] = '\0';
  monkeyname[0x15] = '\0';
  monkeyname[0x16] = '\0';
  monkeyname[0x17] = '\0';
  monkeyname[0x18] = '\0';
  monkeyname[0x19] = '\0';
  monkeyname[0x1a] = '\0';
  monkeyname[0x1b] = '\0';
  monkeyname[0x1c] = '\0';
  monkeyname[0x1d] = '\0';
  monkeyname[0x1e] = '\0';
  monkeyname[0x1f] = '\0';
  monkeyname[0x20] = '\0';
  monkeyname[0x21] = '\0';
  monkeyname[0x22] = '\0';
  monkeyname[0x23] = '\0';
  monkeyname[0x24] = '\0';
  monkeyname[0x25] = '\0';
  monkeyname[0x26] = '\0';
  monkeyname[0x27] = '\0';
  monkeyname[0x28] = '\0';
  monkeyname[0x29] = '\0';
  monkeyname[0x2a] = '\0';
  monkeyname[0x2b] = '\0';
  monkeyname[0x2c] = '\0';
  monkeyname[0x2d] = '\0';
  monkeyname[0x2e] = '\0';
  monkeyname[0x2f] = '\0';
  monkeyname[0x30] = '\0';
  monkeyname[0x31] = '\0';
  monkeyname[0x32] = '\0';
  monkeyname[0x33] = '\0';
  monkeyname[0x34] = '\0';
  monkeyname[0x35] = '\0';
  monkeyname[0x36] = '\0';
  monkeyname[0x37] = '\0';
  monkeyname[0x38] = '\0';
  monkeyname[0x39] = '\0';
  monkeyname[0x3a] = '\0';
  monkeyname[0x3b] = '\0';
  monkeyname[0x3c] = '\0';
  monkeyname[0x3d] = '\0';
  monkeyname[0x3e] = '\0';
  wolfname[0x30] = '\0';
  wolfname[0x31] = '\0';
  wolfname[0x32] = '\0';
  wolfname[0x33] = '\0';
  wolfname[0x34] = '\0';
  wolfname[0x35] = '\0';
  wolfname[0x36] = '\0';
  wolfname[0x37] = '\0';
  wolfname[0x38] = '\0';
  wolfname[0x39] = '\0';
  wolfname[0x3a] = '\0';
  wolfname[0x3b] = '\0';
  wolfname[0x3c] = '\0';
  wolfname[0x3d] = '\0';
  wolfname[0x3e] = '\0';
  wolfname[0x20] = '\0';
  wolfname[0x21] = '\0';
  wolfname[0x22] = '\0';
  wolfname[0x23] = '\0';
  wolfname[0x24] = '\0';
  wolfname[0x25] = '\0';
  wolfname[0x26] = '\0';
  wolfname[0x27] = '\0';
  wolfname[0x28] = '\0';
  wolfname[0x29] = '\0';
  wolfname[0x2a] = '\0';
  wolfname[0x2b] = '\0';
  wolfname[0x2c] = '\0';
  wolfname[0x2d] = '\0';
  wolfname[0x2e] = '\0';
  wolfname[0x2f] = '\0';
  wolfname[0x10] = '\0';
  wolfname[0x11] = '\0';
  wolfname[0x12] = '\0';
  wolfname[0x13] = '\0';
  wolfname[0x14] = '\0';
  wolfname[0x15] = '\0';
  wolfname[0x16] = '\0';
  wolfname[0x17] = '\0';
  wolfname[0x18] = '\0';
  wolfname[0x19] = '\0';
  wolfname[0x1a] = '\0';
  wolfname[0x1b] = '\0';
  wolfname[0x1c] = '\0';
  wolfname[0x1d] = '\0';
  wolfname[0x1e] = '\0';
  wolfname[0x1f] = '\0';
  wolfname[0] = '\0';
  wolfname[1] = '\0';
  wolfname[2] = '\0';
  wolfname[3] = '\0';
  wolfname[4] = '\0';
  wolfname[5] = '\0';
  wolfname[6] = '\0';
  wolfname[7] = '\0';
  wolfname[8] = '\0';
  wolfname[9] = '\0';
  wolfname[10] = '\0';
  wolfname[0xb] = '\0';
  wolfname[0xc] = '\0';
  wolfname[0xd] = '\0';
  wolfname[0xe] = '\0';
  wolfname[0xf] = '\0';
  crocname[0x30] = '\0';
  crocname[0x31] = '\0';
  crocname[0x32] = '\0';
  crocname[0x33] = '\0';
  crocname[0x34] = '\0';
  crocname[0x35] = '\0';
  crocname[0x36] = '\0';
  crocname[0x37] = '\0';
  crocname[0x38] = '\0';
  crocname[0x39] = '\0';
  crocname[0x3a] = '\0';
  crocname[0x3b] = '\0';
  crocname[0x3c] = '\0';
  crocname[0x3d] = '\0';
  crocname[0x3e] = '\0';
  crocname[0x20] = '\0';
  crocname[0x21] = '\0';
  crocname[0x22] = '\0';
  crocname[0x23] = '\0';
  crocname[0x24] = '\0';
  crocname[0x25] = '\0';
  crocname[0x26] = '\0';
  crocname[0x27] = '\0';
  crocname[0x28] = '\0';
  crocname[0x29] = '\0';
  crocname[0x2a] = '\0';
  crocname[0x2b] = '\0';
  crocname[0x2c] = '\0';
  crocname[0x2d] = '\0';
  crocname[0x2e] = '\0';
  crocname[0x2f] = '\0';
  crocname[0x10] = '\0';
  crocname[0x11] = '\0';
  crocname[0x12] = '\0';
  crocname[0x13] = '\0';
  crocname[0x14] = '\0';
  crocname[0x15] = '\0';
  crocname[0x16] = '\0';
  crocname[0x17] = '\0';
  crocname[0x18] = '\0';
  crocname[0x19] = '\0';
  crocname[0x1a] = '\0';
  crocname[0x1b] = '\0';
  crocname[0x1c] = '\0';
  crocname[0x1d] = '\0';
  crocname[0x1e] = '\0';
  crocname[0x1f] = '\0';
  crocname[0] = '\0';
  crocname[1] = '\0';
  crocname[2] = '\0';
  crocname[3] = '\0';
  crocname[4] = '\0';
  crocname[5] = '\0';
  crocname[6] = '\0';
  crocname[7] = '\0';
  crocname[8] = '\0';
  crocname[9] = '\0';
  crocname[10] = '\0';
  crocname[0xb] = '\0';
  crocname[0xc] = '\0';
  crocname[0xd] = '\0';
  crocname[0xe] = '\0';
  crocname[0xf] = '\0';
  ratname[0x30] = '\0';
  ratname[0x31] = '\0';
  ratname[0x32] = '\0';
  ratname[0x33] = '\0';
  ratname[0x34] = '\0';
  ratname[0x35] = '\0';
  ratname[0x36] = '\0';
  ratname[0x37] = '\0';
  ratname[0x38] = '\0';
  ratname[0x39] = '\0';
  ratname[0x3a] = '\0';
  ratname[0x3b] = '\0';
  ratname[0x3c] = '\0';
  ratname[0x3d] = '\0';
  ratname[0x3e] = '\0';
  ratname[0x20] = '\0';
  ratname[0x21] = '\0';
  ratname[0x22] = '\0';
  ratname[0x23] = '\0';
  ratname[0x24] = '\0';
  ratname[0x25] = '\0';
  ratname[0x26] = '\0';
  ratname[0x27] = '\0';
  ratname[0x28] = '\0';
  ratname[0x29] = '\0';
  ratname[0x2a] = '\0';
  ratname[0x2b] = '\0';
  ratname[0x2c] = '\0';
  ratname[0x2d] = '\0';
  ratname[0x2e] = '\0';
  ratname[0x2f] = '\0';
  ratname[0x10] = '\0';
  ratname[0x11] = '\0';
  ratname[0x12] = '\0';
  ratname[0x13] = '\0';
  ratname[0x14] = '\0';
  ratname[0x15] = '\0';
  ratname[0x16] = '\0';
  ratname[0x17] = '\0';
  ratname[0x18] = '\0';
  ratname[0x19] = '\0';
  ratname[0x1a] = '\0';
  ratname[0x1b] = '\0';
  ratname[0x1c] = '\0';
  ratname[0x1d] = '\0';
  ratname[0x1e] = '\0';
  ratname[0x1f] = '\0';
  ratname[0] = '\0';
  ratname[1] = '\0';
  ratname[2] = '\0';
  ratname[3] = '\0';
  ratname[4] = '\0';
  ratname[5] = '\0';
  ratname[6] = '\0';
  ratname[7] = '\0';
  ratname[8] = '\0';
  ratname[9] = '\0';
  ratname[10] = '\0';
  ratname[0xb] = '\0';
  ratname[0xc] = '\0';
  ratname[0xd] = '\0';
  ratname[0xe] = '\0';
  ratname[0xf] = '\0';
  youmonst.meating = 0;
  youmonst._116_4_ = 0;
  youmonst._96_4_ = 0;
  youmonst.mfleetim = '\0';
  youmonst.wormno = '\0';
  youmonst.weapon_check = '\0';
  youmonst._103_1_ = 0;
  youmonst.misc_worn_check = 0;
  youmonst.mnamelth = '\0';
  youmonst.mxtyp = '\0';
  youmonst.mxlth = 0;
  youmonst.my = '\0';
  youmonst.mux = '\0';
  youmonst.muy = '\0';
  youmonst.malign = '\0';
  youmonst.movement = 0;
  youmonst.mintrinsics = 0;
  youmonst.mtame = '\0';
  youmonst.m_ap_type = '\0';
  youmonst.mfrozen = '\0';
  youmonst.mblinded = '\0';
  youmonst.mappearance = 0;
  youmonst.mstrategy = 0;
  youmonst.mtrack[0].x = '\0';
  youmonst.mtrack[0].y = '\0';
  youmonst.mtrack[1].x = '\0';
  youmonst.mtrack[1].y = '\0';
  youmonst.mtrack[2].x = '\0';
  youmonst.mtrack[2].y = '\0';
  youmonst.mtrack[3].x = '\0';
  youmonst.mtrack[3].y = '\0';
  youmonst.mnum = 0;
  youmonst.m_lev = '\0';
  youmonst.mx = '\0';
  youmonst.mhpmax = 0;
  youmonst.mspec_used = 0;
  youmonst.mtrapseen = 0;
  youmonst.mlstmv = 0;
  youmonst.mw = (obj *)0x0;
  youmonst.m_id = 0;
  youmonst.mhp = 0;
  youmonst.dlevel = (level *)0x0;
  youmonst.minvent = (obj *)0x0;
  youmonst.nmon = (monst *)0x0;
  youmonst.data = (permonst *)0x0;
  upermonst.mflags1 = 0;
  upermonst.mflags2 = 0;
  upermonst.mflags3 = 0;
  upermonst.mresists = '\0';
  upermonst.mconveys = '\0';
  upermonst.mcolor = '\0';
  upermonst._61_3_ = 0;
  upermonst.mattk[4].aatyp = '\0';
  upermonst.mattk[4].adtyp = '\0';
  upermonst.mattk[4].damn = '\0';
  upermonst.mattk[4].damd = '\0';
  upermonst.mattk[5].aatyp = '\0';
  upermonst.mattk[5].adtyp = '\0';
  upermonst.mattk[5].damn = '\0';
  upermonst.mattk[5].damd = '\0';
  upermonst.cwt = 0;
  upermonst.cnutrit = 0;
  upermonst.pxtyp = 0;
  upermonst.msound = '\0';
  upermonst.msize = '\0';
  upermonst.mattk[0].aatyp = '\0';
  upermonst.mattk[0].adtyp = '\0';
  upermonst.mattk[0].damn = '\0';
  upermonst.mattk[0].damd = '\0';
  upermonst.mattk[1].aatyp = '\0';
  upermonst.mattk[1].adtyp = '\0';
  upermonst.mattk[1].damn = '\0';
  upermonst.mattk[1].damd = '\0';
  upermonst.mattk[2].aatyp = '\0';
  upermonst.mattk[2].adtyp = '\0';
  upermonst.mattk[2].damn = '\0';
  upermonst.mattk[2].damd = '\0';
  upermonst.mattk[3].aatyp = '\0';
  upermonst.mattk[3].adtyp = '\0';
  upermonst.mattk[3].damn = '\0';
  upermonst.mattk[3].damd = '\0';
  upermonst.mname = (char *)0x0;
  upermonst.mlet = '\0';
  upermonst.mlevel = '\0';
  upermonst.mmove = '\0';
  upermonst.ac = '\0';
  upermonst.mr = '\0';
  upermonst.maligntyp = '\0';
  upermonst.geno = 0;
  zeroobj.owornmask = 0;
  zeroobj.oextra[0] = 0;
  zeroobj.corpsenm = 0;
  zeroobj.oeaten = 0;
  zeroobj.onamelth = '\0';
  zeroobj._89_1_ = 0;
  zeroobj.oxlth = 0;
  zeroobj.age = 0;
  zeroobj.oprops_known = 0;
  zeroobj.where = '\0';
  zeroobj.timed = '\0';
  zeroobj._74_6_ = 0;
  zeroobj.quan = 0;
  zeroobj.spe = '\0';
  zeroobj.oclass = '\0';
  zeroobj.invlet = '\0';
  zeroobj.oartifact = '\0';
  zeroobj.oprops = 0;
  zeroobj.olev = (level *)0x0;
  zeroobj.ox = '\0';
  zeroobj.oy = '\0';
  zeroobj.otyp = 0;
  zeroobj.owt = 0;
  zeroobj.cobj = (obj *)0x0;
  zeroobj.o_id = 0;
  zeroobj._28_4_ = 0;
  zeroobj.nobj = (obj *)0x0;
  zeroobj.v.v_nexthere = (obj *)0x0;
  memset(mvitals,0,0x4b9);
  memset(spl_book,0,0x160);
  memset(disco,0,0x434);
  digging = (dig_info)ZEXT816(0);
  inv_pos.x = '\0';
  inv_pos.y = '\0';
  memset(multi_txt,0,0x100);
  memset(toplines,0,0x1e00);
  toplines_count[0] = 0;
  toplines_count[1] = 0;
  toplines_count[2] = 0;
  toplines_count[3] = 0;
  toplines_count[4] = 0;
  toplines_count[5] = 0;
  toplines_count[6] = 0;
  toplines_count[7] = 0;
  toplines_count[8] = 0;
  toplines_count[9] = 0;
  toplines_count[10] = 0;
  toplines_count[0xb] = 0;
  toplines_count[0xc] = 0;
  toplines_count[0xd] = 0;
  toplines_count[0xe] = 0;
  toplines_count[0xf] = 0;
  toplines_count[0x10] = 0;
  toplines_count[0x11] = 0;
  toplines_count[0x12] = 0;
  toplines_count[0x13] = 0;
  toplines_count[0x14] = 0;
  toplines_count[0x15] = 0;
  toplines_count[0x16] = 0;
  toplines_count[0x17] = 0;
  toplines_count[0x18] = 0;
  toplines_count[0x19] = 0;
  toplines_count[0x1a] = 0;
  toplines_count[0x1b] = 0;
  toplines_count[0x1c] = 0;
  toplines_count[0x1d] = 0;
  level = (level *)0x0;
  killer_format = 0;
  delay_start = 0;
  occtime = 0;
  multi = 0;
  afternmv = (_func_int *)0x0;
  occupation = (_func_int *)0x0;
  killer = (char *)0x0;
  ffruit = (fruit *)0x0;
  current_fruit = 0;
  sp_levchn = (s_level *)0x0;
  mrg_to_wielded = '\0';
  unweapon = '\0';
  stoned = '\0';
  in_mklev = '\0';
  uball = (obj *)0x0;
  uchain = (obj *)0x0;
  ublindf = (obj *)0x0;
  uleft = (obj *)0x0;
  uright = (obj *)0x0;
  uamul = (obj *)0x0;
  uarmf = (obj *)0x0;
  uarmg = (obj *)0x0;
  uarms = (obj *)0x0;
  uarmh = (obj *)0x0;
  uarmc = (obj *)0x0;
  uskin = (obj *)0x0;
  uarmu = (obj *)0x0;
  uquiver = (obj *)0x0;
  uswapwep = (obj *)0x0;
  uarm = (obj *)0x0;
  uwep = (obj *)0x0;
  invent = (obj *)0x0;
  current_wand = (obj *)0x0;
  magic_chest_objs = (obj *)0x0;
  book = (obj *)0x0;
  in_steed_dismounting = '\0';
  wailmsg = 0;
  bhitpos.y = '\0';
  bhitpos.x = '\0';
  preferred_pet = '\0';
  mydogs = (monst *)0x0;
  migrating_mons = (monst *)0x0;
  vision_full_recalc = '\0';
  viz_array = (char **)0x0;
  artilist = (artifact *)0x0;
  stetho_last_used_movement = 0;
  stetho_last_used_move = -1;
  alchemy_init_done = '\0';
  branch_id = 0;
  histevents = (histevent *)0x0;
  histcount = 0;
  curline = 0;
  program_state.restoring = iVar5;
  iflags._40_5_ = CONCAT14(bVar2,iflags.pilesize);
  iflags.ap_rules = pnVar3;
  iflags.mt_rules = pnVar4;
  iflags.hp_notify_fmt = pcVar1;
  flags.moonphase = 10;
  lastinvnr = 0x33;
  flags.soundok = '\x01';
  return;
}

Assistant:

void init_data(void)
{
    boolean in_restore = program_state.restoring;
    
    /* iflags may already contain valid, important data, because init_data() runs
     * as part of the game init sequence after options have been set, etc. */
    boolean nolog = iflags.disable_log;
    struct nh_autopickup_rules *rules = iflags.ap_rules;
    struct nh_msgtype_rules *mt_rules = iflags.mt_rules;
    char *hp_notify_fmt = iflags.hp_notify_fmt;
    moves = 1;
    
    memset(&program_state, 0, sizeof(program_state));
    memset(&flags, 0, sizeof(flags));
    memset(&iflags, 0, sizeof(iflags));
    memset(&quest_status, 0, sizeof(quest_status));
    memset(&levels, 0, sizeof(levels));
    memset(bases, 0, sizeof(bases));
    memset(&u, 0, sizeof(u));
    memset(dogname, 0, sizeof(dogname));
    memset(catname, 0, sizeof(catname));
    memset(horsename, 0, sizeof(horsename));
    memset(monkeyname, 0, sizeof(monkeyname));
    memset(wolfname, 0, sizeof(wolfname));
    memset(crocname, 0, sizeof(crocname));
    memset(ratname, 0, sizeof(ratname));
    memset(&youmonst, 0, sizeof(youmonst));
    memset(&upermonst, 0, sizeof(upermonst));
    memset(&zeroobj, 0, sizeof(zeroobj));
    memset(mvitals, 0, sizeof(mvitals));
    memset(spl_book, 0, sizeof(spl_book));
    memset(disco, 0, sizeof(disco));
    memset(&digging, 0, sizeof(digging));
    memset(&inv_pos, 0, sizeof(inv_pos));
    memset(multi_txt, 0, sizeof(multi_txt));
    memset(toplines, 0, sizeof(toplines));
    memset(toplines_count, 0, sizeof(toplines_count));
    
    level = NULL;
    multi = occtime = delay_start = killer_format = 0;
    afternmv = NULL;
    occupation = NULL;
    killer = NULL;
    ffruit = NULL;
    current_fruit = 0;
    sp_levchn = NULL;
    in_mklev = stoned = unweapon = mrg_to_wielded = FALSE;
    current_wand = invent = uwep = uarm = uswapwep = uquiver = uarmu = uskin =
	uarmc = uarmh = uarms = uarmg = uarmf = uamul = uright = uleft =
	ublindf = uchain = uball = NULL;
    magic_chest_objs = NULL;
    book = NULL;
    in_steed_dismounting = FALSE;
    wailmsg = 0;
    bhitpos.x = bhitpos.y = 0;
    preferred_pet = 0;
    migrating_mons = mydogs = NULL;
    vision_full_recalc = FALSE;
    viz_array = NULL;
    artilist = NULL;
    stetho_last_used_movement = 0;
    stetho_last_used_move = -1;
    alchemy_init_done = FALSE;
    branch_id = 0;
    histevents = NULL;
    histcount = 0;
    curline = 0;
    
    program_state.restoring = in_restore;
    iflags.disable_log = nolog;
    iflags.ap_rules = rules;
    iflags.mt_rules = mt_rules;
    iflags.hp_notify_fmt = hp_notify_fmt;
    flags.moonphase = 10; /* invalid value, so that the first call to realtime_tasks will dtrt */
    lastinvnr = 51;
    flags.soundok = 1;
}